

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O2

span<pstore::sat_entry,__1L> __thiscall
pstore::gsl::span<pstore::sat_entry,_65536L>::subspan
          (span<pstore::sat_entry,_65536L> *this,index_type offset,index_type count)

{
  pointer peVar1;
  span<pstore::sat_entry,__1L> sVar2;
  extent_type<_1L> local_20 [2];
  
  if ((ulong)offset < 0x10001) {
    if (count == -1) {
      count = 0x10000 - offset;
    }
    else if ((count < 0) || (0x10000 < (ulong)(count + offset))) goto LAB_0012102e;
    peVar1 = (this->storage_).data_;
    details::extent_type<-1L>::extent_type(local_20,count);
    sVar2.storage_.data_ = peVar1 + offset;
    sVar2.storage_.super_extent_type<_1L>.size_ = local_20[0].size_;
    return (span<pstore::sat_entry,__1L>)sVar2.storage_;
  }
LAB_0012102e:
  assert_failed("(offset == 0 || (offset > 0 && offset <= size ())) && (count == dynamic_extent || (count >= 0 && offset + count <= size ()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x17b);
}

Assistant:

span<element_type, dynamic_extent>
            subspan (index_type const offset, index_type const count = dynamic_extent) const
                noexcept {
                PSTORE_ASSERT (
                    (offset == 0 || (offset > 0 && offset <= size ())) &&
                    (count == dynamic_extent || (count >= 0 && offset + count <= size ())));
                return {data () + offset, count == dynamic_extent ? size () - offset : count};
            }